

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O0

int __thiscall deqp::UniformBlockTests::init(UniformBlockTests *this,EVP_PKEY_CTX *ctx)

{
  GLSLVersion GVar1;
  Context *pCVar2;
  DataType DVar3;
  bool bVar4;
  int extraout_EAX;
  TestNode *pTVar5;
  TestNode *pTVar6;
  char *pcVar7;
  BlockSingleStructCase *this_00;
  BlockSingleStructArrayCase *this_01;
  BlockSingleNestedStructCase *this_02;
  BlockSingleNestedStructArrayCase *this_03;
  BlockMultiBasicTypesCase *pBVar8;
  BlockMultiNestedStructCase *pBVar9;
  uint uVar10;
  uint uVar11;
  uint local_928;
  uint local_7e8;
  uint local_738;
  TestCaseGroup *randomGroup;
  deUint32 matFlags;
  deUint32 unused;
  deUint32 allBasicTypes;
  deUint32 allLayouts;
  deUint32 allShaders;
  undefined1 local_6d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  deUint32 local_6b0;
  allocator<char> local_6a9;
  deUint32 baseFlags_8;
  string baseName_1;
  int isArray_5;
  int layoutFlagNdx_8;
  TestCaseGroup *modeGroup_1;
  int modeNdx_5;
  TestCaseGroup *multiNestedStructGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  undefined1 local_639;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  deUint32 local_618;
  allocator<char> local_611;
  deUint32 baseFlags_7;
  string baseName;
  int isArray_4;
  int layoutFlagNdx_7;
  TestCaseGroup *modeGroup;
  int modeNdx_4;
  TestCaseGroup *multiBasicTypesGroup;
  VarType local_5c8;
  allocator<char> local_5a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  int local_548;
  undefined1 local_541;
  int matFlagNdx_2;
  uint local_524;
  uint local_520;
  deUint32 flags_6;
  deUint32 baseFlags_6;
  int numInstances;
  char *typeName_2;
  DataType type_2;
  int basicTypeNdx_2;
  TestCaseGroup *layoutGroup_2;
  TestNode *pTStack_4f8;
  int layoutFlagNdx_6;
  TestCaseGroup *instanceArrayBasicTypeGroup;
  uint local_4e8;
  deUint32 flags_5;
  deUint32 baseFlags_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  undefined1 local_4a0 [8];
  string name_3;
  int local_478;
  int isArray_3;
  int layoutFlagNdx_5;
  int modeNdx_3;
  TestCaseGroup *singleNestedStructArrayGroup;
  deUint32 flags_4;
  deUint32 baseFlags_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  undefined1 local_418 [8];
  string name_2;
  int local_3f0;
  int isArray_2;
  int layoutFlagNdx_4;
  int modeNdx_2;
  TestCaseGroup *singleNestedStructGroup;
  deUint32 flags_3;
  deUint32 baseFlags_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  undefined1 local_390 [8];
  string name_1;
  int local_368;
  int isArray_1;
  int layoutFlagNdx_3;
  int modeNdx_1;
  TestCaseGroup *singleStructArrayGroup;
  deUint32 flags_2;
  deUint32 baseFlags_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  undefined1 local_308 [8];
  string name;
  int local_2e0;
  int isArray;
  int layoutFlagNdx_2;
  int modeNdx;
  TestCaseGroup *singleStructGroup;
  VarType local_2c8;
  VarType local_2b0;
  allocator<char> local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  int local_230;
  undefined1 local_229;
  int matFlagNdx_1;
  VarType local_210;
  uint local_1f4;
  uint local_1f0;
  deUint32 flags_1;
  deUint32 baseFlags_1;
  int arraySize;
  char *typeName_1;
  DataType type_1;
  int basicTypeNdx_1;
  TestCaseGroup *layoutGroup_1;
  TestNode *pTStack_1c8;
  int layoutFlagNdx_1;
  TestCaseGroup *singleBasicArrayGroup;
  VarType local_1b8;
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  int local_f4;
  int local_f0;
  int precNdx_1;
  int matFlagNdx;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  int local_68;
  undefined1 local_61;
  int precNdx;
  uint local_48;
  uint local_44;
  deUint32 flags;
  deUint32 baseFlags;
  char *typeName;
  DataType type;
  int basicTypeNdx;
  TestCaseGroup *layoutGroup;
  int layoutFlagNdx;
  TestNode *local_18;
  TestCaseGroup *singleBasicTypeGroup;
  UniformBlockTests *this_local;
  
  singleBasicTypeGroup = (TestCaseGroup *)this;
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_basic_type","Single basic variable in single buffer");
  local_18 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (layoutGroup._0_4_ = 0; (int)layoutGroup < 3; layoutGroup._0_4_ = (int)layoutGroup + 1) {
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[(int)layoutGroup].name,"");
    _type = pTVar5;
    tcu::TestNode::addChild(local_18,pTVar5);
    for (typeName._4_4_ = 0; typeName._4_4_ < 0x19; typeName._4_4_ = typeName._4_4_ + 1) {
      typeName._0_4_ = init::basicTypes[typeName._4_4_];
      _flags = glu::getDataTypeName((DataType)typeName);
      local_44 = init::layoutFlags[(int)layoutGroup].flags;
      if ((local_44 & 0x10) == 0) {
        local_738 = 0x300;
      }
      else {
        local_738 = 0x200;
        if (typeName._4_4_ % 2 == 0) {
          local_738 = 0x100;
        }
      }
      local_48 = local_44 | local_738;
      bVar4 = glu::isDataTypeBoolOrBVec((DataType)typeName);
      pTVar5 = _type;
      if (bVar4) {
        pTVar6 = (TestNode *)operator_new(0xb0);
        pcVar7 = _flags;
        local_61 = 1;
        pCVar2 = (this->super_TestCaseGroup).m_context;
        GVar1 = this->m_glslVersion;
        ub::VarType::VarType((VarType *)&precNdx,(DataType)typeName,0);
        BlockBasicTypeCase::BlockBasicTypeCase
                  ((BlockBasicTypeCase *)pTVar6,pCVar2,pcVar7,"",GVar1,(VarType *)&precNdx,local_48,
                   0);
        local_61 = 0;
        tcu::TestNode::addChild(pTVar5,pTVar6);
        ub::VarType::~VarType((VarType *)&precNdx);
      }
      else {
        for (local_68 = 0; pTVar5 = _type, local_68 < 3; local_68 = local_68 + 1) {
          pTVar6 = (TestNode *)operator_new(0xb0);
          precNdx_1._3_1_ = 1;
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar7 = init::precisionFlags[local_68].name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar7,&local_c9);
          std::operator+(&local_a8,&local_c8,"_");
          std::operator+(&local_88,&local_a8,_flags);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          GVar1 = this->m_glslVersion;
          ub::VarType::VarType
                    ((VarType *)&matFlagNdx,(DataType)typeName,init::precisionFlags[local_68].flags)
          ;
          BlockBasicTypeCase::BlockBasicTypeCase
                    ((BlockBasicTypeCase *)pTVar6,pCVar2,pcVar7,"",GVar1,(VarType *)&matFlagNdx,
                     local_48,0);
          precNdx_1._3_1_ = 0;
          tcu::TestNode::addChild(pTVar5,pTVar6);
          ub::VarType::~VarType((VarType *)&matFlagNdx);
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::allocator<char>::~allocator(&local_c9);
        }
      }
      bVar4 = glu::isDataTypeMatrix((DataType)typeName);
      if (bVar4) {
        for (local_f0 = 0; local_f0 < 2; local_f0 = local_f0 + 1) {
          for (local_f4 = 0; pTVar5 = _type, local_f4 < 3; local_f4 = local_f4 + 1) {
            pTVar6 = (TestNode *)operator_new(0xb0);
            singleBasicArrayGroup._7_1_ = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            pcVar7 = init::matrixFlags[local_f0].name;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_198,pcVar7,&local_199);
            std::operator+(&local_178,&local_198,"_");
            std::operator+(&local_158,&local_178,init::precisionFlags[local_f4].name);
            std::operator+(&local_138,&local_158,"_");
            std::operator+(&local_118,&local_138,_flags);
            pcVar7 = (char *)std::__cxx11::string::c_str();
            GVar1 = this->m_glslVersion;
            ub::VarType::VarType(&local_1b8,(DataType)typeName,init::precisionFlags[local_f4].flags)
            ;
            BlockBasicTypeCase::BlockBasicTypeCase
                      ((BlockBasicTypeCase *)pTVar6,pCVar2,pcVar7,"",GVar1,&local_1b8,
                       local_48 | init::matrixFlags[local_f0].flags,0);
            singleBasicArrayGroup._7_1_ = 0;
            tcu::TestNode::addChild(pTVar5,pTVar6);
            ub::VarType::~VarType(&local_1b8);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&local_198);
            std::allocator<char>::~allocator(&local_199);
          }
        }
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_basic_array","Single basic array variable in single buffer");
  pTStack_1c8 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (layoutGroup_1._4_4_ = 0; layoutGroup_1._4_4_ < 3;
      layoutGroup_1._4_4_ = layoutGroup_1._4_4_ + 1) {
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[layoutGroup_1._4_4_].name,"");
    _type_1 = pTVar5;
    tcu::TestNode::addChild(pTStack_1c8,pTVar5);
    for (typeName_1._4_4_ = 0; typeName_1._4_4_ < 0x19; typeName_1._4_4_ = typeName_1._4_4_ + 1) {
      typeName_1._0_4_ = init::basicTypes[typeName_1._4_4_];
      _baseFlags_1 = glu::getDataTypeName((DataType)typeName_1);
      pTVar5 = _type_1;
      flags_1 = 3;
      local_1f0 = init::layoutFlags[layoutGroup_1._4_4_].flags;
      if ((local_1f0 & 0x10) == 0) {
        local_7e8 = 0x300;
      }
      else {
        local_7e8 = 0x200;
        if (typeName_1._4_4_ % 2 == 0) {
          local_7e8 = 0x100;
        }
      }
      local_1f4 = local_1f0 | local_7e8;
      pTVar6 = (TestNode *)operator_new(0xb0);
      DVar3 = (DataType)typeName_1;
      pcVar7 = _baseFlags_1;
      local_229 = 1;
      pCVar2 = (this->super_TestCaseGroup).m_context;
      GVar1 = this->m_glslVersion;
      bVar4 = glu::isDataTypeBoolOrBVec((DataType)typeName_1);
      ub::VarType::VarType((VarType *)&matFlagNdx_1,DVar3,((byte)~bVar4 & 1) << 2);
      ub::VarType::VarType(&local_210,(VarType *)&matFlagNdx_1,3);
      BlockBasicTypeCase::BlockBasicTypeCase
                ((BlockBasicTypeCase *)pTVar6,pCVar2,pcVar7,"",GVar1,&local_210,local_1f4,0);
      local_229 = 0;
      tcu::TestNode::addChild(pTVar5,pTVar6);
      ub::VarType::~VarType(&local_210);
      ub::VarType::~VarType((VarType *)&matFlagNdx_1);
      bVar4 = glu::isDataTypeMatrix((DataType)typeName_1);
      if (bVar4) {
        for (local_230 = 0; pTVar5 = _type_1, local_230 < 2; local_230 = local_230 + 1) {
          pTVar6 = (TestNode *)operator_new(0xb0);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar7 = init::matrixFlags[local_230].name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,pcVar7,&local_291)
          ;
          std::operator+(&local_270,&local_290,"_");
          std::operator+(&local_250,&local_270,_baseFlags_1);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          GVar1 = this->m_glslVersion;
          ub::VarType::VarType(&local_2c8,(DataType)typeName_1,4);
          ub::VarType::VarType(&local_2b0,&local_2c8,3);
          BlockBasicTypeCase::BlockBasicTypeCase
                    ((BlockBasicTypeCase *)pTVar6,pCVar2,pcVar7,"",GVar1,&local_2b0,
                     local_1f4 | init::matrixFlags[local_230].flags,0);
          tcu::TestNode::addChild(pTVar5,pTVar6);
          ub::VarType::~VarType(&local_2b0);
          ub::VarType::~VarType(&local_2c8);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_290);
          std::allocator<char>::~allocator(&local_291);
        }
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_struct","Single struct in uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (isArray = 0; isArray < 2; isArray = isArray + 1) {
    for (local_2e0 = 0; local_2e0 < 3; local_2e0 = local_2e0 + 1) {
      for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 2;
          name.field_2._12_4_ = name.field_2._12_4_ + 1) {
        pcVar7 = init::bufferModes[isArray].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&baseFlags_2,pcVar7,(allocator<char> *)((long)&flags_2 + 3));
        std::operator+(&local_328,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &baseFlags_2,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_308,&local_328,init::layoutFlags[local_2e0].name);
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&baseFlags_2);
        std::allocator<char>::~allocator((allocator<char> *)((long)&flags_2 + 3));
        uVar11 = init::layoutFlags[local_2e0].flags;
        uVar10 = 0x300;
        if ((uVar11 & 0x10) != 0) {
          uVar10 = 0x100;
        }
        if ((init::bufferModes[isArray].mode != BUFFERMODE_SINGLE) || (name.field_2._12_4_ != 0)) {
          if (name.field_2._12_4_ != 0) {
            std::__cxx11::string::operator+=((string *)local_308,"_instance_array");
          }
          this_00 = (BlockSingleStructCase *)operator_new(0xb8);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar7 = (char *)std::__cxx11::string::c_str();
          BlockSingleStructCase::BlockSingleStructCase
                    (this_00,pCVar2,pcVar7,"",this->m_glslVersion,uVar11 | uVar10,
                     init::bufferModes[isArray].mode,
                     (uint)(name.field_2._12_4_ != 0) + (uint)(name.field_2._12_4_ != 0) * 2);
          tcu::TestNode::addChild(pTVar5,(TestNode *)this_00);
        }
        std::__cxx11::string::~string((string *)local_308);
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_struct_array","Struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (isArray_1 = 0; isArray_1 < 2; isArray_1 = isArray_1 + 1) {
    for (local_368 = 0; local_368 < 3; local_368 = local_368 + 1) {
      for (name_1.field_2._12_4_ = 0; (int)name_1.field_2._12_4_ < 2;
          name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
        pcVar7 = init::bufferModes[isArray_1].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&baseFlags_3,pcVar7,(allocator<char> *)((long)&flags_3 + 3));
        std::operator+(&local_3b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &baseFlags_3,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_390,&local_3b0,init::layoutFlags[local_368].name);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&baseFlags_3);
        std::allocator<char>::~allocator((allocator<char> *)((long)&flags_3 + 3));
        uVar11 = init::layoutFlags[local_368].flags;
        uVar10 = 0x300;
        if ((uVar11 & 0x10) != 0) {
          uVar10 = 0x200;
        }
        if ((init::bufferModes[isArray_1].mode != BUFFERMODE_SINGLE) || (name_1.field_2._12_4_ != 0)
           ) {
          if (name_1.field_2._12_4_ != 0) {
            std::__cxx11::string::operator+=((string *)local_390,"_instance_array");
          }
          this_01 = (BlockSingleStructArrayCase *)operator_new(0xb8);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar7 = (char *)std::__cxx11::string::c_str();
          BlockSingleStructArrayCase::BlockSingleStructArrayCase
                    (this_01,pCVar2,pcVar7,"",this->m_glslVersion,uVar11 | uVar10,
                     init::bufferModes[isArray_1].mode,
                     (uint)(name_1.field_2._12_4_ != 0) + (uint)(name_1.field_2._12_4_ != 0) * 2);
          tcu::TestNode::addChild(pTVar5,(TestNode *)this_01);
        }
        std::__cxx11::string::~string((string *)local_390);
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_nested_struct","Nested struct in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (isArray_2 = 0; isArray_2 < 2; isArray_2 = isArray_2 + 1) {
    for (local_3f0 = 0; local_3f0 < 3; local_3f0 = local_3f0 + 1) {
      for (name_2.field_2._12_4_ = 0; (int)name_2.field_2._12_4_ < 2;
          name_2.field_2._12_4_ = name_2.field_2._12_4_ + 1) {
        pcVar7 = init::bufferModes[isArray_2].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&baseFlags_4,pcVar7,(allocator<char> *)((long)&flags_4 + 3));
        std::operator+(&local_438,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &baseFlags_4,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_418,&local_438,init::layoutFlags[local_3f0].name);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&baseFlags_4);
        std::allocator<char>::~allocator((allocator<char> *)((long)&flags_4 + 3));
        uVar11 = init::layoutFlags[local_3f0].flags;
        uVar10 = 0x300;
        if ((uVar11 & 0x10) != 0) {
          uVar10 = 0x100;
        }
        if ((init::bufferModes[isArray_2].mode != BUFFERMODE_SINGLE) || (name_2.field_2._12_4_ != 0)
           ) {
          if (name_2.field_2._12_4_ != 0) {
            std::__cxx11::string::operator+=((string *)local_418,"_instance_array");
          }
          this_02 = (BlockSingleNestedStructCase *)operator_new(0xb8);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar7 = (char *)std::__cxx11::string::c_str();
          BlockSingleNestedStructCase::BlockSingleNestedStructCase
                    (this_02,pCVar2,pcVar7,"",this->m_glslVersion,uVar11 | uVar10,
                     init::bufferModes[isArray_2].mode,
                     (uint)(name_2.field_2._12_4_ != 0) + (uint)(name_2.field_2._12_4_ != 0) * 2);
          tcu::TestNode::addChild(pTVar5,(TestNode *)this_02);
        }
        std::__cxx11::string::~string((string *)local_418);
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_nested_struct_array","Nested struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (isArray_3 = 0; isArray_3 < 2; isArray_3 = isArray_3 + 1) {
    for (local_478 = 0; local_478 < 3; local_478 = local_478 + 1) {
      for (name_3.field_2._12_4_ = 0; (int)name_3.field_2._12_4_ < 2;
          name_3.field_2._12_4_ = name_3.field_2._12_4_ + 1) {
        pcVar7 = init::bufferModes[isArray_3].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&baseFlags_5,pcVar7,(allocator<char> *)((long)&flags_5 + 3));
        std::operator+(&local_4c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &baseFlags_5,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4a0,&local_4c0,init::layoutFlags[local_478].name);
        std::__cxx11::string::~string((string *)&local_4c0);
        std::__cxx11::string::~string((string *)&baseFlags_5);
        std::allocator<char>::~allocator((allocator<char> *)((long)&flags_5 + 3));
        local_4e8 = init::layoutFlags[local_478].flags;
        uVar11 = 0x300;
        if ((local_4e8 & 0x10) != 0) {
          uVar11 = 0x200;
        }
        instanceArrayBasicTypeGroup._4_4_ = local_4e8 | uVar11;
        if ((init::bufferModes[isArray_3].mode != BUFFERMODE_SINGLE) || (name_3.field_2._12_4_ != 0)
           ) {
          if (name_3.field_2._12_4_ != 0) {
            std::__cxx11::string::operator+=((string *)local_4a0,"_instance_array");
          }
          this_03 = (BlockSingleNestedStructArrayCase *)operator_new(0xb8);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar7 = (char *)std::__cxx11::string::c_str();
          BlockSingleNestedStructArrayCase::BlockSingleNestedStructArrayCase
                    (this_03,pCVar2,pcVar7,"",this->m_glslVersion,instanceArrayBasicTypeGroup._4_4_,
                     init::bufferModes[isArray_3].mode,
                     (uint)(name_3.field_2._12_4_ != 0) + (uint)(name_3.field_2._12_4_ != 0) * 2);
          tcu::TestNode::addChild(pTVar5,(TestNode *)this_03);
        }
        std::__cxx11::string::~string((string *)local_4a0);
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "instance_array_basic_type","Single basic variable in instance array");
  pTStack_4f8 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (layoutGroup_2._4_4_ = 0; layoutGroup_2._4_4_ < 3;
      layoutGroup_2._4_4_ = layoutGroup_2._4_4_ + 1) {
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[layoutGroup_2._4_4_].name,"");
    _type_2 = pTVar5;
    tcu::TestNode::addChild(pTStack_4f8,pTVar5);
    for (typeName_2._4_4_ = 0; typeName_2._4_4_ < 0x19; typeName_2._4_4_ = typeName_2._4_4_ + 1) {
      typeName_2._0_4_ = init::basicTypes[typeName_2._4_4_];
      _baseFlags_6 = glu::getDataTypeName((DataType)typeName_2);
      pTVar5 = _type_2;
      flags_6 = 3;
      local_520 = init::layoutFlags[layoutGroup_2._4_4_].flags;
      if ((local_520 & 0x10) == 0) {
        local_928 = 0x300;
      }
      else {
        local_928 = 0x200;
        if (typeName_2._4_4_ % 2 == 0) {
          local_928 = 0x100;
        }
      }
      local_524 = local_520 | local_928;
      pTVar6 = (TestNode *)operator_new(0xb0);
      DVar3 = (DataType)typeName_2;
      pcVar7 = _baseFlags_6;
      local_541 = 1;
      pCVar2 = (this->super_TestCaseGroup).m_context;
      GVar1 = this->m_glslVersion;
      bVar4 = glu::isDataTypeBoolOrBVec((DataType)typeName_2);
      ub::VarType::VarType((VarType *)&matFlagNdx_2,DVar3,((byte)~bVar4 & 1) << 2);
      BlockBasicTypeCase::BlockBasicTypeCase
                ((BlockBasicTypeCase *)pTVar6,pCVar2,pcVar7,"",GVar1,(VarType *)&matFlagNdx_2,
                 local_524,3);
      local_541 = 0;
      tcu::TestNode::addChild(pTVar5,pTVar6);
      ub::VarType::~VarType((VarType *)&matFlagNdx_2);
      bVar4 = glu::isDataTypeMatrix((DataType)typeName_2);
      if (bVar4) {
        for (local_548 = 0; pTVar5 = _type_2, local_548 < 2; local_548 = local_548 + 1) {
          pTVar6 = (TestNode *)operator_new(0xb0);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar7 = init::matrixFlags[local_548].name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,pcVar7,&local_5a9)
          ;
          std::operator+(&local_588,&local_5a8,"_");
          std::operator+(&local_568,&local_588,_baseFlags_6);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          GVar1 = this->m_glslVersion;
          ub::VarType::VarType(&local_5c8,(DataType)typeName_2,4);
          BlockBasicTypeCase::BlockBasicTypeCase
                    ((BlockBasicTypeCase *)pTVar6,pCVar2,pcVar7,"",GVar1,&local_5c8,
                     local_524 | init::matrixFlags[local_548].flags,3);
          tcu::TestNode::addChild(pTVar5,pTVar6);
          ub::VarType::~VarType(&local_5c8);
          std::__cxx11::string::~string((string *)&local_568);
          std::__cxx11::string::~string((string *)&local_588);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::allocator<char>::~allocator(&local_5a9);
        }
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "multi_basic_types","Multiple buffers with basic types");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (modeGroup._4_4_ = 0; modeGroup._4_4_ < 2; modeGroup._4_4_ = modeGroup._4_4_ + 1) {
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[modeGroup._4_4_].name,"");
    tcu::TestNode::addChild(pTVar5,pTVar6);
    for (baseName.field_2._12_4_ = 0; (int)baseName.field_2._12_4_ < 3;
        baseName.field_2._12_4_ = baseName.field_2._12_4_ + 1) {
      for (baseName.field_2._8_4_ = 0; (int)baseName.field_2._8_4_ < 2;
          baseName.field_2._8_4_ = baseName.field_2._8_4_ + 1) {
        pcVar7 = init::layoutFlags[(int)baseName.field_2._12_4_].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&baseFlags_7,pcVar7,&local_611)
        ;
        std::allocator<char>::~allocator(&local_611);
        local_618 = init::layoutFlags[(int)baseName.field_2._12_4_].flags;
        if (baseName.field_2._8_4_ != 0) {
          std::__cxx11::string::operator+=((string *)&baseFlags_7,"_instance_array");
        }
        pBVar8 = (BlockMultiBasicTypesCase *)operator_new(0xc0);
        local_639 = 1;
        pCVar2 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_638,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &baseFlags_7,"_mixed");
        pcVar7 = (char *)std::__cxx11::string::c_str();
        BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
                  (pBVar8,pCVar2,pcVar7,"",this->m_glslVersion,local_618 | 0x100,local_618 | 0x200,
                   init::bufferModes[modeGroup._4_4_].mode,
                   (uint)(baseName.field_2._8_4_ != 0) + (uint)(baseName.field_2._8_4_ != 0) * 2);
        local_639 = 0;
        tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar8);
        std::__cxx11::string::~string((string *)&local_638);
        if ((local_618 & 0x10) == 0) {
          pBVar8 = (BlockMultiBasicTypesCase *)operator_new(0xc0);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_660,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &baseFlags_7,"_both");
          pcVar7 = (char *)std::__cxx11::string::c_str();
          BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
                    (pBVar8,pCVar2,pcVar7,"",this->m_glslVersion,local_618 | 0x300,local_618 | 0x300
                     ,init::bufferModes[modeGroup._4_4_].mode,
                     (uint)(baseName.field_2._8_4_ != 0) + (uint)(baseName.field_2._8_4_ != 0) * 2);
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar8);
          std::__cxx11::string::~string((string *)&local_660);
        }
        std::__cxx11::string::~string((string *)&baseFlags_7);
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "multi_nested_struct","Multiple buffers with nested structs");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (modeGroup_1._4_4_ = 0; modeGroup_1._4_4_ < 2; modeGroup_1._4_4_ = modeGroup_1._4_4_ + 1) {
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[modeGroup_1._4_4_].name,"");
    tcu::TestNode::addChild(pTVar5,pTVar6);
    for (baseName_1.field_2._12_4_ = 0; (int)baseName_1.field_2._12_4_ < 3;
        baseName_1.field_2._12_4_ = baseName_1.field_2._12_4_ + 1) {
      for (baseName_1.field_2._8_4_ = 0; (int)baseName_1.field_2._8_4_ < 2;
          baseName_1.field_2._8_4_ = baseName_1.field_2._8_4_ + 1) {
        pcVar7 = init::layoutFlags[(int)baseName_1.field_2._12_4_].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&baseFlags_8,pcVar7,&local_6a9)
        ;
        std::allocator<char>::~allocator(&local_6a9);
        local_6b0 = init::layoutFlags[(int)baseName_1.field_2._12_4_].flags;
        if (baseName_1.field_2._8_4_ != 0) {
          std::__cxx11::string::operator+=((string *)&baseFlags_8,"_instance_array");
        }
        pBVar9 = (BlockMultiNestedStructCase *)operator_new(0xc0);
        local_6d1 = 1;
        pCVar2 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_6d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &baseFlags_8,"_mixed");
        pcVar7 = (char *)std::__cxx11::string::c_str();
        BlockMultiNestedStructCase::BlockMultiNestedStructCase
                  (pBVar9,pCVar2,pcVar7,"",this->m_glslVersion,local_6b0 | 0x100,local_6b0 | 0x200,
                   init::bufferModes[modeGroup_1._4_4_].mode,
                   (uint)(baseName_1.field_2._8_4_ != 0) + (uint)(baseName_1.field_2._8_4_ != 0) * 2
                  );
        local_6d1 = 0;
        tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar9);
        std::__cxx11::string::~string((string *)&local_6d0);
        if ((local_6b0 & 0x10) == 0) {
          pBVar9 = (BlockMultiNestedStructCase *)operator_new(0xc0);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &allShaders,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &baseFlags_8,"_both");
          pcVar7 = (char *)std::__cxx11::string::c_str();
          BlockMultiNestedStructCase::BlockMultiNestedStructCase
                    (pBVar9,pCVar2,pcVar7,"",this->m_glslVersion,local_6b0 | 0x300,local_6b0 | 0x300
                     ,init::bufferModes[modeGroup_1._4_4_].mode,
                     (uint)(baseName_1.field_2._8_4_ != 0) +
                     (uint)(baseName_1.field_2._8_4_ != 0) * 2);
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar9);
          std::__cxx11::string::~string((string *)&allShaders);
        }
        std::__cxx11::string::~string((string *)&baseFlags_8);
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Random Uniform Block cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"scalar_types",
             "Scalar types only, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x3fc0,
             10,0);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"vector_types",
             "Scalar and vector types only, per-block buffers",this->m_glslVersion,
             BUFFERMODE_PER_BLOCK,0x3fc1,10,0x19);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"basic_types",
             "All basic types, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7fc3,10
             ,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"basic_arrays",
             "Arrays, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7fc7,10,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"basic_instance_arrays",
             "Basic instance arrays, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,
             0x7fe3,10,0x4b);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"nested_structs",
             "Nested structs, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7fcb,10,
             100);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"nested_structs_arrays",
             "Nested structs, arrays, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,
             0x7fcf,10,0x96);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,
             "nested_structs_instance_arrays","Nested structs, instance arrays, per-block buffers",
             this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7feb,10,0x7d);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,
             "nested_structs_arrays_instance_arrays",
             "Nested structs, instance arrays, per-block buffers",this->m_glslVersion,
             BUFFERMODE_PER_BLOCK,0x7fef,10,0xaf);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"all_per_block_buffers",
             "All random features, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,
             0xffffffff,0x14,200);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"all_shared_buffer",
             "All random features, shared buffer",this->m_glslVersion,BUFFERMODE_SINGLE,0xffffffff,
             0x14,0xfa);
  return extraout_EAX;
}

Assistant:

void UniformBlockTests::init(void)
{
	static const glu::DataType basicTypes[] = { glu::TYPE_FLOAT,		glu::TYPE_FLOAT_VEC2,   glu::TYPE_FLOAT_VEC3,
												glu::TYPE_FLOAT_VEC4,   glu::TYPE_INT,			glu::TYPE_INT_VEC2,
												glu::TYPE_INT_VEC3,		glu::TYPE_INT_VEC4,		glu::TYPE_UINT,
												glu::TYPE_UINT_VEC2,	glu::TYPE_UINT_VEC3,	glu::TYPE_UINT_VEC4,
												glu::TYPE_BOOL,			glu::TYPE_BOOL_VEC2,	glu::TYPE_BOOL_VEC3,
												glu::TYPE_BOOL_VEC4,	glu::TYPE_FLOAT_MAT2,   glu::TYPE_FLOAT_MAT3,
												glu::TYPE_FLOAT_MAT4,   glu::TYPE_FLOAT_MAT2X3, glu::TYPE_FLOAT_MAT2X4,
												glu::TYPE_FLOAT_MAT3X2, glu::TYPE_FLOAT_MAT3X4, glu::TYPE_FLOAT_MAT4X2,
												glu::TYPE_FLOAT_MAT4X3 };

	static const struct
	{
		const char* name;
		deUint32	flags;
	} precisionFlags[] = { { "lowp", PRECISION_LOW }, { "mediump", PRECISION_MEDIUM }, { "highp", PRECISION_HIGH } };

	static const struct
	{
		const char* name;
		deUint32	flags;
	} layoutFlags[] = { { "shared", LAYOUT_SHARED }, { "packed", LAYOUT_PACKED }, { "std140", LAYOUT_STD140 } };

	static const struct
	{
		const char* name;
		deUint32	flags;
	} matrixFlags[] = { { "row_major", LAYOUT_ROW_MAJOR }, { "column_major", LAYOUT_COLUMN_MAJOR } };

	static const struct
	{
		const char*					 name;
		UniformBlockCase::BufferMode mode;
	} bufferModes[] = { { "per_block_buffer", UniformBlockCase::BUFFERMODE_PER_BLOCK },
						{ "single_buffer", UniformBlockCase::BUFFERMODE_SINGLE } };

	// ubo.single_basic_type
	{
		tcu::TestCaseGroup* singleBasicTypeGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_basic_type", "Single basic variable in single buffer");
		addChild(singleBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType type		= basicTypes[basicTypeNdx];
				const char*   typeName  = glu::getDataTypeName(type);
				deUint32	  baseFlags = layoutFlags[layoutFlagNdx].flags;
				deUint32	  flags		= baseFlags | ((baseFlags & LAYOUT_PACKED) ?
												  (basicTypeNdx % 2 == 0 ? DECLARE_VERTEX : DECLARE_FRAGMENT) :
												  DECLARE_BOTH);

				if (glu::isDataTypeBoolOrBVec(type))
					layoutGroup->addChild(new BlockBasicTypeCase(m_context, typeName, "", m_glslVersion,
																 VarType(type, 0), flags, 0 /* no instance array */));
				else
				{
					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
						layoutGroup->addChild(new BlockBasicTypeCase(
							m_context, (string(precisionFlags[precNdx].name) + "_" + typeName).c_str(), "",
							m_glslVersion, VarType(type, precisionFlags[precNdx].flags), flags,
							0 /* no instance array */));
				}

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
					{
						for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
							layoutGroup->addChild(new BlockBasicTypeCase(
								m_context,
								(string(matrixFlags[matFlagNdx].name) + "_" + precisionFlags[precNdx].name + "_" +
								 typeName)
									.c_str(),
								"", m_glslVersion, VarType(type, precisionFlags[precNdx].flags),
								flags | matrixFlags[matFlagNdx].flags, 0 /* no instance array */));
					}
				}
			}
		}
	}

	// ubo.single_basic_array
	{
		tcu::TestCaseGroup* singleBasicArrayGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_basic_array", "Single basic array variable in single buffer");
		addChild(singleBasicArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType type		= basicTypes[basicTypeNdx];
				const char*   typeName  = glu::getDataTypeName(type);
				const int	 arraySize = 3;
				deUint32	  baseFlags = layoutFlags[layoutFlagNdx].flags;
				deUint32	  flags		= baseFlags | ((baseFlags & LAYOUT_PACKED) ?
												  (basicTypeNdx % 2 == 0 ? DECLARE_VERTEX : DECLARE_FRAGMENT) :
												  DECLARE_BOTH);

				layoutGroup->addChild(new BlockBasicTypeCase(
					m_context, typeName, "", m_glslVersion,
					VarType(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), arraySize), flags,
					0 /* no instance array */));

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						layoutGroup->addChild(new BlockBasicTypeCase(
							m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(), "",
							m_glslVersion, VarType(VarType(type, PRECISION_HIGH), arraySize),
							flags | matrixFlags[matFlagNdx].flags, 0 /* no instance array */));
				}
			}
		}
	}

	// ubo.single_struct
	{
		tcu::TestCaseGroup* singleStructGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_struct", "Single struct in uniform block");
		addChild(singleStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_VERTEX : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleStructGroup->addChild(new BlockSingleStructCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_struct_array
	{
		tcu::TestCaseGroup* singleStructArrayGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_struct_array", "Struct array in one uniform block");
		addChild(singleStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_FRAGMENT : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleStructArrayGroup->addChild(new BlockSingleStructArrayCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct
	{
		tcu::TestCaseGroup* singleNestedStructGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_nested_struct", "Nested struct in one uniform block");
		addChild(singleNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_VERTEX : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleNestedStructGroup->addChild(new BlockSingleNestedStructCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct_array
	{
		tcu::TestCaseGroup* singleNestedStructArrayGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_nested_struct_array", "Nested struct array in one uniform block");
		addChild(singleNestedStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_FRAGMENT : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleNestedStructArrayGroup->addChild(new BlockSingleNestedStructArrayCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.instance_array_basic_type
	{
		tcu::TestCaseGroup* instanceArrayBasicTypeGroup =
			new tcu::TestCaseGroup(m_testCtx, "instance_array_basic_type", "Single basic variable in instance array");
		addChild(instanceArrayBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			instanceArrayBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType type		   = basicTypes[basicTypeNdx];
				const char*   typeName	 = glu::getDataTypeName(type);
				const int	 numInstances = 3;
				deUint32	  baseFlags	= layoutFlags[layoutFlagNdx].flags;
				deUint32	  flags		   = baseFlags | ((baseFlags & LAYOUT_PACKED) ?
												  (basicTypeNdx % 2 == 0 ? DECLARE_VERTEX : DECLARE_FRAGMENT) :
												  DECLARE_BOTH);

				layoutGroup->addChild(new BlockBasicTypeCase(
					m_context, typeName, "", m_glslVersion,
					VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), flags, numInstances));

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						layoutGroup->addChild(new BlockBasicTypeCase(
							m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(), "",
							m_glslVersion, VarType(type, PRECISION_HIGH), flags | matrixFlags[matFlagNdx].flags,
							numInstances));
				}
			}
		}
	}

	// ubo.multi_basic_types
	{
		tcu::TestCaseGroup* multiBasicTypesGroup =
			new tcu::TestCaseGroup(m_testCtx, "multi_basic_types", "Multiple buffers with basic types");
		addChild(multiBasicTypesGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiBasicTypesGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string baseName  = layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiBasicTypesCase(
						m_context, (baseName + "_mixed").c_str(), "", m_glslVersion, baseFlags | DECLARE_VERTEX,
						baseFlags | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiBasicTypesCase(
							m_context, (baseName + "_both").c_str(), "", m_glslVersion,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.multi_nested_struct
	{
		tcu::TestCaseGroup* multiNestedStructGroup =
			new tcu::TestCaseGroup(m_testCtx, "multi_nested_struct", "Multiple buffers with nested structs");
		addChild(multiNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiNestedStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string baseName  = layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiNestedStructCase(
						m_context, (baseName + "_mixed").c_str(), "", m_glslVersion, baseFlags | DECLARE_VERTEX,
						baseFlags | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiNestedStructCase(
							m_context, (baseName + "_both").c_str(), "", m_glslVersion,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.random
	{
		const deUint32 allShaders	= FEATURE_VERTEX_BLOCKS | FEATURE_FRAGMENT_BLOCKS | FEATURE_SHARED_BLOCKS;
		const deUint32 allLayouts	= FEATURE_PACKED_LAYOUT | FEATURE_SHARED_LAYOUT | FEATURE_STD140_LAYOUT;
		const deUint32 allBasicTypes = FEATURE_VECTORS | FEATURE_MATRICES;
		const deUint32 unused		 = FEATURE_UNUSED_MEMBERS | FEATURE_UNUSED_UNIFORMS;
		const deUint32 matFlags		 = FEATURE_MATRIX_LAYOUT;

		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random Uniform Block cases");
		addChild(randomGroup);

		// Basic types.
		createRandomCaseGroup(randomGroup, m_context, "scalar_types", "Scalar types only, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK, allShaders | allLayouts | unused,
							  10, 0);
		createRandomCaseGroup(randomGroup, m_context, "vector_types", "Scalar and vector types only, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | FEATURE_VECTORS, 10, 25);
		createRandomCaseGroup(randomGroup, m_context, "basic_types", "All basic types, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags, 10, 50);
		createRandomCaseGroup(randomGroup, m_context, "basic_arrays", "Arrays, per-block buffers", m_glslVersion,
							  UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_ARRAYS, 10, 50);

		createRandomCaseGroup(
			randomGroup, m_context, "basic_instance_arrays", "Basic instance arrays, per-block buffers", m_glslVersion,
			UniformBlockCase::BUFFERMODE_PER_BLOCK,
			allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_INSTANCE_ARRAYS, 10, 75);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs", "Nested structs, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS, 10, 100);
		createRandomCaseGroup(
			randomGroup, m_context, "nested_structs_arrays", "Nested structs, arrays, per-block buffers", m_glslVersion,
			UniformBlockCase::BUFFERMODE_PER_BLOCK,
			allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS | FEATURE_ARRAYS, 10, 150);
		createRandomCaseGroup(
			randomGroup, m_context, "nested_structs_instance_arrays",
			"Nested structs, instance arrays, per-block buffers", m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
			allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS | FEATURE_INSTANCE_ARRAYS, 10,
			125);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_arrays_instance_arrays",
							  "Nested structs, instance arrays, per-block buffers", m_glslVersion,
							  UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS |
								  FEATURE_ARRAYS | FEATURE_INSTANCE_ARRAYS,
							  10, 175);

		createRandomCaseGroup(randomGroup, m_context, "all_per_block_buffers", "All random features, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK, ~0u, 20, 200);
		createRandomCaseGroup(randomGroup, m_context, "all_shared_buffer", "All random features, shared buffer",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_SINGLE, ~0u, 20, 250);
	}
}